

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Uint32 Diligent::AdapterVendorToVendorId(ADAPTER_VENDOR Vendor)

{
  Uint32 local_c;
  ADAPTER_VENDOR Vendor_local;
  
  switch(Vendor) {
  case ADAPTER_VENDOR_NVIDIA:
    local_c = 0x10de;
    break;
  case ADAPTER_VENDOR_AMD:
    local_c = 0x1002;
    break;
  case ADAPTER_VENDOR_INTEL:
    local_c = 0x8086;
    break;
  case ADAPTER_VENDOR_ARM:
    local_c = 0x13b5;
    break;
  case ADAPTER_VENDOR_QUALCOMM:
    local_c = 0x5143;
    break;
  case ADAPTER_VENDOR_IMGTECH:
    local_c = 0x1010;
    break;
  case ADAPTER_VENDOR_MSFT:
    local_c = 0x1414;
    break;
  case ADAPTER_VENDOR_APPLE:
    local_c = 0x106b;
    break;
  case ADAPTER_VENDOR_MESA:
    local_c = 0x10005;
    break;
  case ADAPTER_VENDOR_BROADCOM:
    local_c = 0x14e4;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

Uint32 AdapterVendorToVendorId(ADAPTER_VENDOR Vendor)
{
    static_assert(ADAPTER_VENDOR_LAST == 10, "Please update the switch below to handle the new adapter type");
    switch (Vendor)
    {
#define VENDOR_TO_VENDOR_ID(Name) \
    case ADAPTER_VENDOR_##Name: return ADAPTER_VENDOR_ID_##Name

        VENDOR_TO_VENDOR_ID(AMD);
        VENDOR_TO_VENDOR_ID(NVIDIA);
        VENDOR_TO_VENDOR_ID(INTEL);
        VENDOR_TO_VENDOR_ID(ARM);
        VENDOR_TO_VENDOR_ID(QUALCOMM);
        VENDOR_TO_VENDOR_ID(IMGTECH);
        VENDOR_TO_VENDOR_ID(MSFT);
        VENDOR_TO_VENDOR_ID(APPLE);
        VENDOR_TO_VENDOR_ID(MESA);
        VENDOR_TO_VENDOR_ID(BROADCOM);
#undef VENDOR_TO_VENDOR_ID

        default:
            return 0;
    }
}